

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderDiscardCase::ShaderDiscardCase
          (ShaderDiscardCase *this,Context *context,char *name,char *description,char *shaderSource,
          ShaderEvalFunc evalFunc,deUint32 flags)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  ShaderEvalFunc evalFunc_local;
  char *shaderSource_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderDiscardCase *this_local;
  
  testCtx = gles2::Context::getTestContext(context);
  renderCtx = gles2::Context::getRenderContext(context);
  ctxInfo = gles2::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,false,evalFunc
            );
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderDiscardCase_032888a8;
  this->m_flags = flags;
  this->m_brickTexture = (Texture2D *)0x0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,shaderSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,
             "attribute highp   vec4 a_position;\nattribute highp   vec4 a_coords;\nvarying   mediump vec4 v_color;\nvarying   mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    v_coords = a_coords;\n}\n"
            );
  return;
}

Assistant:

ShaderDiscardCase::ShaderDiscardCase (Context& context, const char* name, const char* description, const char* shaderSource, ShaderEvalFunc evalFunc, deUint32 flags)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, false, evalFunc)
	, m_flags			(flags)
	, m_brickTexture	(DE_NULL)
{
	m_fragShaderSource	= shaderSource;
	m_vertShaderSource	=
		"attribute highp   vec4 a_position;\n"
		"attribute highp   vec4 a_coords;\n"
		"varying   mediump vec4 v_color;\n"
		"varying   mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    v_coords = a_coords;\n"
		"}\n";
}